

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlskey_openssl.cpp
# Opt level: O0

void __thiscall
QTlsPrivate::TlsKeyOpenSSL::decodeDer
          (TlsKeyOpenSSL *this,KeyType type,KeyAlgorithm algorithm,QByteArray *der,
          QByteArray *passPhrase,bool deepClear)

{
  long lVar1;
  bool bVar2;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  undefined1 unaff_retaddr;
  undefined7 in_stack_00000008;
  QByteArray pem;
  QMap<QByteArray,_QByteArray> headers;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QByteArray::isEmpty((QByteArray *)0x14c6c9);
  if (!bVar2) {
    *(undefined4 *)(in_RDI + 0xc) = in_ESI;
    *(undefined4 *)(in_RDI + 0x10) = in_EDX;
    QMap<QByteArray,_QByteArray>::QMap((QMap<QByteArray,_QByteArray> *)0x14c6fc);
    TlsKeyBase::pemFromDer
              ((TlsKeyBase *)0xaaaaaaaaaaaaaaaa,(QByteArray *)0xaaaaaaaaaaaaaaaa,
               (QMap<QByteArray,_QByteArray> *)0xaaaaaaaaaaaaaaaa);
    decodePem((TlsKeyOpenSSL *)CONCAT44(type,algorithm),der._4_4_,(KeyAlgorithm)der,passPhrase,
              (QByteArray *)CONCAT17(deepClear,in_stack_00000008),(bool)unaff_retaddr);
    QByteArray::~QByteArray((QByteArray *)0x14c767);
    QMap<QByteArray,_QByteArray>::~QMap((QMap<QByteArray,_QByteArray> *)0x14c771);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TlsKeyOpenSSL::decodeDer(QSsl::KeyType type, QSsl::KeyAlgorithm algorithm, const QByteArray &der,
                              const QByteArray &passPhrase, bool deepClear)
{
    if (der.isEmpty())
        return;

    keyType = type;
    keyAlgorithm = algorithm;

    QMap<QByteArray, QByteArray> headers;
    const auto pem = pemFromDer(der, headers);

    decodePem(type, algorithm, pem, passPhrase, deepClear);
}